

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

wchar_t cmd_get_effect_from_list
                  (command_conflict *cmd,char *arg,int *choice,char *prompt,effect *effect,
                  wchar_t count,_Bool allow_random)

{
  int iVar1;
  wchar_t wVar2;
  effect *effect_00;
  wchar_t wVar3;
  char *__s1;
  cmd_arg_data_conflict data;
  long lVar4;
  
  if ((count == L'\xffffffff') && (count = L'\0', effect_00 = effect, effect != (effect *)0x0)) {
    do {
      count = count + L'\x01';
      effect_00 = effect_next(effect_00);
    } while (effect_00 != (effect *)0x0);
  }
  __s1 = cmd->arg[0].name;
  lVar4 = 4;
  do {
    iVar1 = strcmp(__s1,arg);
    if (iVar1 == 0) {
      if (((cmd_arg *)(__s1 + -0x10))->type == arg_CHOICE) {
        wVar3 = ((cmd_arg_data_conflict *)(__s1 + -8))->choice;
        wVar2 = L'\xfffffffe';
        if (wVar3 == L'\xfffffffe' && allow_random) goto LAB_00130c8a;
        if (L'\xffffffff' < wVar3 && wVar3 < count) goto LAB_00130c9c;
      }
      break;
    }
    __s1 = __s1 + 0x28;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  wVar2 = get_effect_from_list(prompt,effect,count,allow_random);
LAB_00130c8a:
  wVar3 = wVar2;
  data = (cmd_arg_data_conflict)0xfffffffe;
  if (wVar3 != L'\xfffffffe' || !allow_random) {
LAB_00130c9c:
    data.point.y = 0;
    data.number = wVar3;
    if (count <= wVar3 || wVar3 < L'\0') {
      return L'\xfffffffd';
    }
  }
  cmd_set_arg(cmd,arg,arg_CHOICE,data);
  *choice = data.choice;
  return L'\0';
}

Assistant:

int cmd_get_effect_from_list(struct command *cmd, const char *arg, int *choice,
	const char *prompt, struct effect *effect, int count,
	bool allow_random)
{
	int selection;

	if (count == -1) {
		struct effect *cursor = effect;

		count = 0;
		while (cursor) {
			++count;
			cursor = effect_next(cursor);
		}
	}

	if (cmd_get_arg_choice(cmd, arg, &selection) != CMD_OK ||
			((selection != -2 || !allow_random) &&
			(selection < 0 || selection >= count))) {
		/* It isn't in the command or is invalid; prompt. */
		selection = get_effect_from_list(prompt, effect, count,
			allow_random);
	}
	if ((selection == -2 && allow_random) ||
			(selection >= 0 && selection < count)) {
		/* Record the selection in the command. */
		cmd_set_arg_choice(cmd, arg, selection);
		*choice = selection;
		return CMD_OK;
	}
	return CMD_ARG_ABORTED;
}